

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode Curl_parse_port(Curl_URL *u,char *hostname)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  CURLUcode CVar5;
  char *pcVar6;
  char endbracket;
  int len;
  char *rest;
  char portbuf [7];
  char local_4d;
  int local_4c;
  char *local_48;
  Curl_URL *local_40;
  char local_37 [7];
  
  iVar2 = __isoc99_sscanf(hostname,"[%*45[0123456789abcdefABCDEF:.]%c%n",&local_4d,&local_4c);
  iVar3 = local_4c;
  if (iVar2 == 1) {
    if (local_4d == '%') {
      local_40 = u;
      iVar2 = __isoc99_sscanf(hostname + local_4c,"25%*[^]]%c%n",&local_4d,&local_4c);
      local_4c = local_4c + iVar3;
      u = local_40;
      if (local_4d != ']' || iVar2 != 1) {
        return CURLUE_MALFORMED_INPUT;
      }
    }
    else if (local_4d != ']') {
      return CURLUE_MALFORMED_INPUT;
    }
    pcVar6 = hostname + local_4c;
    if (pcVar6 != (char *)0x0) {
      if (*pcVar6 == ':') goto LAB_001481aa;
      if (*pcVar6 != '\0') {
        return CURLUE_MALFORMED_INPUT;
      }
    }
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = strchr(hostname,0x3a);
  }
LAB_001481aa:
  if (pcVar6 != (char *)0x0) {
    if (pcVar6[1] == 0) {
      *pcVar6 = '\0';
      bVar1 = false;
      CVar5 = CURLUE_OK;
    }
    else {
      iVar3 = Curl_isdigit((uint)(byte)pcVar6[1]);
      CVar5 = CURLUE_BAD_PORT_NUMBER;
      if (((iVar3 == 0) ||
          (lVar4 = strtol(pcVar6 + 1,&local_48,10), lVar4 - 0x10000U < 0xffffffffffff0001)) ||
         (*local_48 != '\0')) {
        bVar1 = false;
      }
      else {
        *pcVar6 = '\0';
        *local_48 = '\0';
        curl_msnprintf(local_37,7,"%ld",lVar4);
        u->portnum = lVar4;
        pcVar6 = (*Curl_cstrdup)(local_37);
        u->port = pcVar6;
        bVar1 = pcVar6 != (char *)0x0;
        CVar5 = (uint)(pcVar6 == (char *)0x0) * 4 + CURLUE_MALFORMED_INPUT;
      }
    }
    if (!bVar1) {
      return CVar5;
    }
  }
  return CURLUE_OK;
}

Assistant:

UNITTEST CURLUcode Curl_parse_port(struct Curl_URL *u, char *hostname)
{
  char *portptr = NULL;
  char endbracket;
  int len;

  /*
   * Find the end of an IPv6 address, either on the ']' ending bracket or
   * a percent-encoded zone index.
   */
  if(1 == sscanf(hostname, "[%*45[0123456789abcdefABCDEF:.]%c%n",
                 &endbracket, &len)) {
    if(']' == endbracket)
      portptr = &hostname[len];
    else if('%' == endbracket) {
      int zonelen = len;
      if(1 == sscanf(hostname + zonelen, "25%*[^]]%c%n", &endbracket, &len)) {
        if(']' != endbracket)
          return CURLUE_MALFORMED_INPUT;
        portptr = &hostname[--zonelen + len + 1];
      }
      else
        return CURLUE_MALFORMED_INPUT;
    }
    else
      return CURLUE_MALFORMED_INPUT;

    /* this is a RFC2732-style specified IP-address */
    if(portptr && *portptr) {
      if(*portptr != ':')
        return CURLUE_MALFORMED_INPUT;
    }
    else
      portptr = NULL;
  }
  else
    portptr = strchr(hostname, ':');

  if(portptr) {
    char *rest;
    long port;
    char portbuf[7];

    /* Browser behavior adaptation. If there's a colon with no digits after,
       just cut off the name there which makes us ignore the colon and just
       use the default port. Firefox, Chrome and Safari all do that. */
    if(!portptr[1]) {
      *portptr = '\0';
      return CURLUE_OK;
    }

    if(!ISDIGIT(portptr[1]))
      return CURLUE_BAD_PORT_NUMBER;

    port = strtol(portptr + 1, &rest, 10);  /* Port number must be decimal */

    if((port <= 0) || (port > 0xffff))
      /* Single unix standard says port numbers are 16 bits long, but we don't
         treat port zero as OK. */
      return CURLUE_BAD_PORT_NUMBER;

    if(rest[0])
      return CURLUE_BAD_PORT_NUMBER;

    *portptr++ = '\0'; /* cut off the name there */
    *rest = 0;
    /* generate a new port number string to get rid of leading zeroes etc */
    msnprintf(portbuf, sizeof(portbuf), "%ld", port);
    u->portnum = port;
    u->port = strdup(portbuf);
    if(!u->port)
      return CURLUE_OUT_OF_MEMORY;
  }

  return CURLUE_OK;
}